

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModelTests.cpp
# Opt level: O2

int testLinearModelBasic(void)

{
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  char *pcVar4;
  allocator local_b2;
  allocator local_b1;
  string local_b0;
  undefined1 local_90 [40];
  LinearModel lr;
  FeatureType local_50;
  FeatureType local_40;
  FeatureType local_30;
  FeatureType local_20;
  
  std::__cxx11::string::string((string *)local_90,"foo",&local_b2);
  std::__cxx11::string::string
            ((string *)&local_b0,"Linear regression model to predict Foo",&local_b1);
  CoreML::LinearModel::LinearModel(&lr,(string *)local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::string((string *)&local_b0,"x",&local_b2);
  CoreML::FeatureType::Int64();
  CoreML::Model::addInput((Result *)local_90,&lr.super_Model,&local_b0,&local_20);
  bVar1 = CoreML::Result::good((Result *)local_90);
  std::__cxx11::string::~string((string *)(local_90 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.m_type.
              super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_b0);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_b0,"y",&local_b2);
    CoreML::FeatureType::Double();
    CoreML::Model::addInput((Result *)local_90,&lr.super_Model,&local_b0,&local_30);
    bVar1 = CoreML::Result::good((Result *)local_90);
    std::__cxx11::string::~string((string *)(local_90 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_30.m_type.
                super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&local_b0);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_b0,"z",&local_b2);
      CoreML::FeatureType::Int64();
      CoreML::Model::addInput((Result *)local_90,&lr.super_Model,&local_b0,&local_40);
      bVar1 = CoreML::Result::good((Result *)local_90);
      std::__cxx11::string::~string((string *)(local_90 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_40.m_type.
                  super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__cxx11::string::~string((string *)&local_b0);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_b0,"foo",&local_b2);
        CoreML::FeatureType::Double();
        CoreML::Model::addOutput((Result *)local_90,&lr.super_Model,&local_b0,&local_50);
        bVar1 = CoreML::Result::good((Result *)local_90);
        std::__cxx11::string::~string((string *)(local_90 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_50.m_type.
                    super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        std::__cxx11::string::~string((string *)&local_b0);
        iVar3 = 0;
        if (bVar1) goto LAB_00137bd6;
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/LinearModelTests.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x14);
        poVar2 = std::operator<<(poVar2,": error: ");
        pcVar4 = "(lr.addOutput(\"foo\", FeatureType::Double())).good()";
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/LinearModelTests.cpp"
                                );
        poVar2 = std::operator<<(poVar2,":");
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x13);
        poVar2 = std::operator<<(poVar2,": error: ");
        pcVar4 = "(lr.addInput(\"z\", FeatureType::Int64())).good()";
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/LinearModelTests.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x12);
      poVar2 = std::operator<<(poVar2,": error: ");
      pcVar4 = "(lr.addInput(\"y\", FeatureType::Double())).good()";
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/LinearModelTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x11);
    poVar2 = std::operator<<(poVar2,": error: ");
    pcVar4 = "(lr.addInput(\"x\", FeatureType::Int64())).good()";
  }
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar2 = std::operator<<(poVar2," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar3 = 1;
LAB_00137bd6:
  CoreML::Model::~Model(&lr.super_Model);
  return iVar3;
}

Assistant:

int testLinearModelBasic() {
    LinearModel lr("foo", "Linear regression model to predict Foo");
    ML_ASSERT_GOOD(lr.addInput("x", FeatureType::Int64()));
    ML_ASSERT_GOOD(lr.addInput("y", FeatureType::Double()));
    ML_ASSERT_GOOD(lr.addInput("z", FeatureType::Int64()));
    ML_ASSERT_GOOD(lr.addOutput("foo", FeatureType::Double()));
    return 0;
}